

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl_check_ctr_renegotiate(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uchar *__s2;
  
  if (ssl->state == 0x10) {
    uVar1 = *(uint *)&ssl->conf->field_0x174;
    if ((uVar1 >> 0xe & 1) != 0 && ssl->renego_status != 3) {
      uVar4 = (ulong)(uVar1 & 2);
      __s2 = ssl->conf->renego_period + uVar4;
      iVar2 = memcmp(ssl->in_ctr + uVar4,__s2,8 - uVar4);
      iVar3 = memcmp(ssl->out_ctr + uVar4,__s2,8 - uVar4);
      if ((0 < iVar2) || (0 < iVar3)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x196a,"record counter limit reached: renegotiate");
        iVar2 = mbedtls_ssl_renegotiate(ssl);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

static int ssl_check_ctr_renegotiate( mbedtls_ssl_context *ssl )
{
    size_t ep_len = ssl_ep_len( ssl );
    int in_ctr_cmp;
    int out_ctr_cmp;

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER ||
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING ||
        ssl->conf->disable_renegotiation == MBEDTLS_SSL_RENEGOTIATION_DISABLED )
    {
        return( 0 );
    }

    in_ctr_cmp = memcmp( ssl->in_ctr + ep_len,
                        ssl->conf->renego_period + ep_len, 8 - ep_len );
    out_ctr_cmp = memcmp( ssl->out_ctr + ep_len,
                          ssl->conf->renego_period + ep_len, 8 - ep_len );

    if( in_ctr_cmp <= 0 && out_ctr_cmp <= 0 )
    {
        return( 0 );
    }

    MBEDTLS_SSL_DEBUG_MSG( 1, ( "record counter limit reached: renegotiate" ) );
    return( mbedtls_ssl_renegotiate( ssl ) );
}